

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ur_kin.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  double *T;
  double *pdVar2;
  long lVar3;
  int iVar4;
  double dVar5;
  double q [6];
  double q_sols [48];
  double local_1e8 [55];
  
  local_1e8[3] = 0.0;
  local_1e8[5] = 0.0;
  local_1e8[0] = 0.0;
  local_1e8[1] = 0.0;
  local_1e8[2] = 1.0;
  local_1e8[4] = 1.0;
  T = (double *)operator_new__(0x80);
  ur_kinematics::forward(local_1e8,T);
  iVar4 = 0;
  pdVar2 = T;
  do {
    lVar3 = 0;
    do {
      printf("%1.3f ",pdVar2[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    iVar4 = iVar4 + 1;
    putchar(10);
    pdVar2 = pdVar2 + 4;
  } while (iVar4 != 4);
  uVar1 = ur_kinematics::inverse(T,local_1e8 + 6,0.0);
  if (0 < (int)uVar1) {
    lVar3 = 0;
    do {
      printf("%1.6f %1.6f %1.6f %1.6f %1.6f %1.6f\n",*(undefined8 *)((long)local_1e8 + lVar3 + 0x30)
             ,*(undefined8 *)((long)local_1e8 + lVar3 + 0x38),
             *(undefined8 *)((long)local_1e8 + lVar3 + 0x40),
             *(undefined8 *)((long)local_1e8 + lVar3 + 0x48),
             *(undefined8 *)((long)local_1e8 + lVar3 + 0x50),
             *(undefined8 *)((long)local_1e8 + lVar3 + 0x58));
      lVar3 = lVar3 + 0x30;
    } while ((ulong)uVar1 * 0x30 != lVar3);
  }
  iVar4 = 5;
  dVar5 = 0.0;
  do {
    printf("%f ",dVar5 * 1.570796326794895);
    dVar5 = dVar5 + 1.0;
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  putchar(10);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
  double q[6] = {0.0, 0.0, 1.0, 0.0, 1.0, 0.0};
  double* T = new double[16];
  forward(q, T);
  for(int i=0;i<4;i++) {
    for(int j=i*4;j<(i+1)*4;j++)
      printf("%1.3f ", T[j]);
    printf("\n");
  }
  double q_sols[8*6];
  int num_sols;
  num_sols = inverse(T, q_sols);
  for(int i=0;i<num_sols;i++)
    printf("%1.6f %1.6f %1.6f %1.6f %1.6f %1.6f\n",
       q_sols[i*6+0], q_sols[i*6+1], q_sols[i*6+2], q_sols[i*6+3], q_sols[i*6+4], q_sols[i*6+5]);
  for(int i=0;i<=4;i++)
    printf("%f ", PI/2.0*i);
  printf("\n");
  return 0;
}